

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_utility.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::DecodeCompactFieldMaskPaths
          (Status *__return_storage_ptr__,converter *this,StringPiece paths,
          PathSinkCallback *path_sink)

{
  StringPiece error_message;
  StringPiece error_message_00;
  StringPiece error_message_01;
  StringPiece error_message_02;
  StringPiece error_message_03;
  undefined8 uVar1;
  uint uVar2;
  stringpiece_ssize_type sVar3;
  undefined1 auVar4 [8];
  _Alloc_hider _Var5;
  char cVar6;
  int iVar7;
  _Map_pointer ppbVar8;
  undefined7 extraout_var;
  undefined8 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  converter *pcVar12;
  stringpiece_ssize_type in_R9;
  long lVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  StringPiece SVar17;
  StringPiece prefix_00;
  StringPiece prefix_01;
  StringPiece segment;
  StringPiece segment_00;
  undefined1 auStack_1a8 [8];
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  prefix;
  AlphaNum local_150;
  AlphaNum local_120;
  string local_f0;
  stringpiece_ssize_type local_d0;
  converter *local_c8;
  ulong local_c0;
  undefined1 local_b8 [52];
  uint local_84;
  undefined1 auStack_80 [8];
  StringPiece paths_local;
  undefined1 local_58 [8];
  string current_prefix;
  AlphaNum *c;
  
  local_d0 = paths.length_;
  paths_local.ptr_ = paths.ptr_;
  prefix.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  prefix.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  prefix.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  prefix.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  prefix.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  prefix.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  prefix.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  prefix.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_1a8 = (undefined1  [8])0x0;
  prefix.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c0 = 0;
  auStack_80 = (undefined1  [8])this;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_1a8,0);
  uVar2 = (uint)paths_local.ptr_;
  uVar11 = (ulong)paths_local.ptr_ & 0xffffffff;
  local_84 = (uint)paths_local.ptr_ >> 0x1f;
  paths_local.length_ = (stringpiece_ssize_type)__return_storage_ptr__;
  if ((int)(uint)paths_local.ptr_ < 0) {
LAB_0031784e:
    uVar10 = 0;
  }
  else {
    iVar7 = (uint)paths_local.ptr_ - 1;
    local_c8 = (converter *)&(__return_storage_ptr__->error_message_).field_2;
    uVar10 = 0;
    current_prefix.field_2._12_4_ = 0;
    uVar14 = 0;
    do {
      current_prefix.field_2._8_4_ = uVar10;
      uVar15 = uVar14;
      if (uVar14 == uVar2) {
LAB_00317257:
        SVar17 = StringPiece::substr((StringPiece *)auStack_80,(long)(int)local_c0,
                                     (long)(int)(uVar14 - (int)local_c0));
        c = (AlphaNum *)SVar17.length_;
        if (prefix.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node ==
            (_Map_pointer)
            prefix.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size) {
          local_58 = (undefined1  [8])&current_prefix._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
        }
        else {
          ppbVar8 = prefix.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          if ((_Elt_pointer)
              prefix.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node ==
              prefix.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            ppbVar8 = (_Map_pointer)
                      (*(long *)((long)&prefix.c.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].
                                        field_2 + 8) + 0x200);
          }
          local_58 = (undefined1  [8])&current_prefix._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,ppbVar8[-4],
                     (long)&(ppbVar8[-3]->_M_dataplus)._M_p + (long)&(ppbVar8[-4]->_M_dataplus)._M_p
                    );
        }
        if (((int)uVar14 < (int)uVar2) &&
           (cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,(long)(int)uVar14),
           _Var5 = current_prefix._M_dataplus, auVar4 = local_58, cVar6 == '(')) {
          if ((long)current_prefix._M_dataplus._M_p < 0) {
            StringPiece::LogFatalSizeTooBig
                      ((size_t)current_prefix._M_dataplus._M_p,"size_t to int conversion");
          }
          prefix_00.length_ = (stringpiece_ssize_type)SVar17.ptr_;
          prefix_00.ptr_ = _Var5._M_p;
          segment.length_ = in_R9;
          segment.ptr_ = (char *)c;
          (anonymous_namespace)::AppendPathSegmentToPrefix_abi_cxx11_
                    ((string *)local_b8,(_anonymous_namespace_ *)auVar4,prefix_00,segment);
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
          bVar16 = (converter *)local_b8._0_8_ == (converter *)(local_b8 + 0x10);
          pcVar12 = (converter *)local_b8._0_8_;
LAB_003174cd:
          path_sink = (PathSinkCallback *)c;
          if (!bVar16) {
            operator_delete(pcVar12);
            path_sink = (PathSinkCallback *)c;
          }
LAB_003174d8:
          c = (AlphaNum *)path_sink;
          if (((int)uVar14 < (int)uVar2) &&
             (cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,(long)(int)uVar14),
             cVar6 == ')')) {
            if (prefix.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node ==
                (_Map_pointer)
                prefix.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size) {
              local_b8._0_8_ = "Invalid FieldMask \'";
              local_b8._8_8_ = (char *)0x13;
              local_120.piece_data_ = (char *)auStack_80;
              local_120.piece_size_ = (size_t)paths_local.ptr_;
              local_150.piece_data_ = "\'. Cannot find matching \'(\' for all \')\'.";
              local_150.piece_size_ = 0x28;
              StrCat_abi_cxx11_(&local_f0,(protobuf *)local_b8,&local_120,&local_150,c);
              error_message.length_ = local_f0._M_string_length;
              error_message.ptr_ = local_f0._M_dataplus._M_p;
              if ((long)local_f0._M_string_length < 0) {
                StringPiece::LogFatalSizeTooBig
                          (local_f0._M_string_length,"size_t to int conversion");
              }
              Status::Status((Status *)paths_local.length_,INVALID_ARGUMENT,error_message);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              goto LAB_0031745c;
            }
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_1a8);
          }
          local_c0 = (ulong)(uVar14 + 1);
          bVar16 = true;
        }
        else {
          _Var5._M_p = current_prefix._M_dataplus._M_p;
          auVar4 = local_58;
          if (c == (AlphaNum *)0x0) goto LAB_003174d8;
          if ((long)current_prefix._M_dataplus._M_p < 0) {
            StringPiece::LogFatalSizeTooBig
                      ((size_t)current_prefix._M_dataplus._M_p,"size_t to int conversion");
          }
          prefix_01.length_ = (stringpiece_ssize_type)SVar17.ptr_;
          prefix_01.ptr_ = _Var5._M_p;
          segment_00.length_ = in_R9;
          segment_00.ptr_ = (char *)c;
          (anonymous_namespace)::AppendPathSegmentToPrefix_abi_cxx11_
                    ((string *)local_b8,(_anonymous_namespace_ *)auVar4,prefix_01,segment_00);
          sVar3 = paths_local.length_;
          uVar1 = local_b8._8_8_;
          uVar9 = local_b8._0_8_;
          if ((long)local_b8._8_8_ < 0) {
            StringPiece::LogFatalSizeTooBig(local_b8._8_8_,"size_t to int conversion");
          }
          local_120.piece_data_ = (char *)uVar9;
          local_120.piece_size_ = uVar1;
          if (*(long *)(local_d0 + 0x10) == 0) {
            uVar9 = std::__throw_bad_function_call();
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_1a8);
            _Unwind_Resume(uVar9);
          }
          (**(code **)(local_d0 + 0x18))(sVar3,local_d0,&local_120);
          if ((converter *)local_b8._0_8_ != (converter *)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_);
          }
          if (*(int *)sVar3 == 0) {
            pcVar12 = *(converter **)(sVar3 + 8);
            bVar16 = pcVar12 == local_c8;
            goto LAB_003174cd;
          }
LAB_0031745c:
          bVar16 = false;
        }
        path_sink = (PathSinkCallback *)c;
        if (local_58 != (undefined1  [8])&current_prefix._M_string_length) {
          operator_delete((void *)local_58);
          path_sink = (PathSinkCallback *)c;
        }
        uVar11 = (ulong)(uint)current_prefix.field_2._8_4_;
        uVar10 = current_prefix.field_2._8_4_;
        if (!bVar16) break;
      }
      else {
        if ((uVar10 & 1) == 0) {
          lVar13 = (long)(int)uVar14;
          cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,lVar13);
          if (cVar6 != '[') {
            cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,lVar13);
            if ((cVar6 != ',') &&
               (cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,lVar13), cVar6 != ')')) {
              cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,lVar13);
              uVar11 = (ulong)(uint)current_prefix.field_2._8_4_;
              if (cVar6 != '(') goto LAB_00317540;
            }
            goto LAB_00317257;
          }
          if ((int)uVar14 < iVar7) {
            cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,(long)(int)(uVar14 + 1));
            uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
            uVar15 = uVar14 + 1;
            if (cVar6 == '\"') goto LAB_00317540;
          }
          local_b8._0_8_ = "Invalid FieldMask \'";
          local_b8._8_8_ = (char *)0x13;
          local_120.piece_data_ = (char *)auStack_80;
          local_120.piece_size_ = (size_t)paths_local.ptr_;
          local_150.piece_data_ = "\'. Map keys should be represented as [\"some_key\"].";
          local_150.piece_size_ = 0x32;
          StrCat_abi_cxx11_((string *)local_58,(protobuf *)local_b8,&local_120,&local_150,
                            (AlphaNum *)path_sink);
          sVar3 = paths_local.length_;
          SVar17.length_ = (stringpiece_ssize_type)current_prefix._M_dataplus._M_p;
          SVar17.ptr_ = (char *)local_58;
          if ((long)current_prefix._M_dataplus._M_p < 0) {
            StringPiece::LogFatalSizeTooBig
                      ((size_t)current_prefix._M_dataplus._M_p,"size_t to int conversion");
          }
          Status::Status((Status *)sVar3,INVALID_ARGUMENT,SVar17);
LAB_003177a6:
          uVar10 = current_prefix.field_2._8_4_;
          if (local_58 != (undefined1  [8])&current_prefix._M_string_length) {
            operator_delete((void *)local_58);
            uVar10 = current_prefix.field_2._8_4_;
          }
          break;
        }
        if ((current_prefix.field_2._12_4_ & 1) == 0) {
          cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,(long)(int)uVar14);
          if (cVar6 == '\\') {
            current_prefix.field_2._12_4_ = (undefined4)CONCAT71(extraout_var,1);
          }
          else {
            cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,(long)(int)uVar14);
            if (cVar6 == '\"') {
              if ((int)uVar14 < iVar7) {
                uVar15 = uVar14 + 1;
                cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,(long)(int)uVar15);
                if (cVar6 == ']') {
                  if ((int)uVar15 < iVar7) {
                    lVar13 = (long)(int)(uVar14 + 2);
                    cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,lVar13);
                    if ((((cVar6 != '.') &&
                         (cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,lVar13),
                         cVar6 != ',')) &&
                        (cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,lVar13),
                        cVar6 != ')')) &&
                       (cVar6 = StringPiece::operator[]((StringPiece *)auStack_80,lVar13),
                       cVar6 != '(')) {
                      local_b8._0_8_ = "Invalid FieldMask \'";
                      local_b8._8_8_ = (char *)0x13;
                      local_120.piece_data_ = (char *)auStack_80;
                      local_120.piece_size_ = (size_t)paths_local.ptr_;
                      local_150.piece_data_ = "\'. Map keys should be at the end of a path segment."
                      ;
                      local_150.piece_size_ = 0x33;
                      StrCat_abi_cxx11_((string *)local_58,(protobuf *)local_b8,&local_120,
                                        &local_150,(AlphaNum *)path_sink);
                      sVar3 = paths_local.length_;
                      error_message_01.length_ =
                           (stringpiece_ssize_type)current_prefix._M_dataplus._M_p;
                      error_message_01.ptr_ = (char *)local_58;
                      if ((long)current_prefix._M_dataplus._M_p < 0) {
                        StringPiece::LogFatalSizeTooBig
                                  ((size_t)current_prefix._M_dataplus._M_p,
                                   "size_t to int conversion");
                      }
                      Status::Status((Status *)sVar3,INVALID_ARGUMENT,error_message_01);
                      if (local_58 != (undefined1  [8])&current_prefix._M_string_length) {
                        operator_delete((void *)local_58);
                      }
                      goto LAB_0031784e;
                    }
                  }
                  current_prefix.field_2._12_4_ = 0;
                  uVar11 = 0;
                  goto LAB_00317540;
                }
              }
              local_b8._0_8_ = "Invalid FieldMask \'";
              local_b8._8_8_ = (char *)0x13;
              local_120.piece_data_ = (char *)auStack_80;
              local_120.piece_size_ = (size_t)paths_local.ptr_;
              local_150.piece_data_ = "\'. Map keys should be represented as [\"some_key\"].";
              local_150.piece_size_ = 0x32;
              StrCat_abi_cxx11_((string *)local_58,(protobuf *)local_b8,&local_120,&local_150,
                                (AlphaNum *)path_sink);
              sVar3 = paths_local.length_;
              error_message_00.length_ = (stringpiece_ssize_type)current_prefix._M_dataplus._M_p;
              error_message_00.ptr_ = (char *)local_58;
              if ((long)current_prefix._M_dataplus._M_p < 0) {
                StringPiece::LogFatalSizeTooBig
                          ((size_t)current_prefix._M_dataplus._M_p,"size_t to int conversion");
              }
              Status::Status((Status *)sVar3,INVALID_ARGUMENT,error_message_00);
              goto LAB_003177a6;
            }
          }
          uVar11 = (ulong)(uint)current_prefix.field_2._8_4_;
        }
        else {
          current_prefix.field_2._12_4_ = 0;
          uVar11 = (ulong)(uint)uVar10;
        }
      }
LAB_00317540:
      uVar14 = uVar15 + 1;
      uVar10 = (undefined4)uVar11;
      uVar11 = CONCAT71((int7)(uVar11 >> 8),(int)uVar2 <= (int)uVar15);
      local_84 = (uint)uVar11;
    } while ((int)uVar15 < (int)uVar2);
  }
  sVar3 = paths_local.length_;
  if ((local_84 & 1) != 0) {
    if ((uVar10 & 1) == 0) {
      if (prefix.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
          (_Map_pointer)
          prefix.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size) {
        Status::Status((Status *)paths_local.length_);
        goto LAB_00317988;
      }
      local_b8._0_8_ = "Invalid FieldMask \'";
      local_b8._8_8_ = (char *)0x13;
      local_120.piece_data_ = (char *)auStack_80;
      local_120.piece_size_ = (size_t)paths_local.ptr_;
      local_150.piece_data_ = "\'. Cannot find matching \')\' for all \'(\'.";
      local_150.piece_size_ = 0x28;
      StrCat_abi_cxx11_((string *)local_58,(protobuf *)local_b8,&local_120,&local_150,
                        (AlphaNum *)path_sink);
      error_message_03.length_ = (stringpiece_ssize_type)current_prefix._M_dataplus._M_p;
      error_message_03.ptr_ = (char *)local_58;
      if ((long)current_prefix._M_dataplus._M_p < 0) {
        StringPiece::LogFatalSizeTooBig
                  ((size_t)current_prefix._M_dataplus._M_p,"size_t to int conversion");
      }
      Status::Status((Status *)sVar3,INVALID_ARGUMENT,error_message_03);
    }
    else {
      local_b8._0_8_ = "Invalid FieldMask \'";
      local_b8._8_8_ = (char *)0x13;
      local_120.piece_data_ = (char *)auStack_80;
      local_120.piece_size_ = (size_t)paths_local.ptr_;
      local_150.piece_data_ = "\'. Cannot find matching \']\' for all \'[\'.";
      local_150.piece_size_ = 0x28;
      StrCat_abi_cxx11_((string *)local_58,(protobuf *)local_b8,&local_120,&local_150,
                        (AlphaNum *)path_sink);
      error_message_02.length_ = (stringpiece_ssize_type)current_prefix._M_dataplus._M_p;
      error_message_02.ptr_ = (char *)local_58;
      if ((long)current_prefix._M_dataplus._M_p < 0) {
        StringPiece::LogFatalSizeTooBig
                  ((size_t)current_prefix._M_dataplus._M_p,"size_t to int conversion");
      }
      Status::Status((Status *)sVar3,INVALID_ARGUMENT,error_message_02);
    }
    if (local_58 != (undefined1  [8])&current_prefix._M_string_length) {
      operator_delete((void *)local_58);
    }
  }
LAB_00317988:
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_1a8);
  return (Status *)sVar3;
}

Assistant:

util::Status DecodeCompactFieldMaskPaths(StringPiece paths,
                                           PathSinkCallback path_sink) {
  std::stack<std::string> prefix;
  int length = paths.length();
  int previous_position = 0;
  bool in_map_key = false;
  bool is_escaping = false;
  // Loops until 1 passed the end of the input to make the handle of the last
  // segment easier.
  for (int i = 0; i <= length; ++i) {
    if (i != length) {
      // Skips everything in a map key until we hit the end of it, which is
      // marked by an un-escaped '"' immediately followed by a ']'.
      if (in_map_key) {
        if (is_escaping) {
          is_escaping = false;
          continue;
        }
        if (paths[i] == '\\') {
          is_escaping = true;
          continue;
        }
        if (paths[i] != '\"') {
          continue;
        }
        // Un-escaped '"' must be followed with a ']'.
        if (i >= length - 1 || paths[i + 1] != ']') {
          return util::Status(
              util::error::INVALID_ARGUMENT,
              StrCat(
                  "Invalid FieldMask '", paths,
                  "'. Map keys should be represented as [\"some_key\"]."));
        }
        // The end of the map key ("\"]") has been found.
        in_map_key = false;
        // Skips ']'.
        i++;
        // Checks whether the key ends at the end of a path segment.
        if (i < length - 1 && paths[i + 1] != '.' && paths[i + 1] != ',' &&
            paths[i + 1] != ')' && paths[i + 1] != '(') {
          return util::Status(
              util::error::INVALID_ARGUMENT,
              StrCat(
                  "Invalid FieldMask '", paths,
                  "'. Map keys should be at the end of a path segment."));
        }
        is_escaping = false;
        continue;
      }

      // We are not in a map key, look for the start of one.
      if (paths[i] == '[') {
        if (i >= length - 1 || paths[i + 1] != '\"') {
          return util::Status(
              util::error::INVALID_ARGUMENT,
              StrCat(
                  "Invalid FieldMask '", paths,
                  "'. Map keys should be represented as [\"some_key\"]."));
        }
        // "[\"" starts a map key.
        in_map_key = true;
        i++;  // Skips the '\"'.
        continue;
      }
      // If the current character is not a special character (',', '(' or ')'),
      // continue to the next.
      if (paths[i] != ',' && paths[i] != ')' && paths[i] != '(') {
        continue;
      }
    }
    // Gets the current segment - sub-string between previous position (after
    // '(', ')', ',', or the beginning of the input) and the current position.
    StringPiece segment =
        paths.substr(previous_position, i - previous_position);
    std::string current_prefix = prefix.empty() ? "" : prefix.top();

    if (i < length && paths[i] == '(') {
      // Builds a prefix and save it into the stack.
      prefix.push(AppendPathSegmentToPrefix(current_prefix, segment));
    } else if (!segment.empty()) {
      // When the current character is ')', ',' or the current position has
      // passed the end of the input, builds and outputs a new paths by
      // concatenating the last prefix with the current segment.
      RETURN_IF_ERROR(
          path_sink(AppendPathSegmentToPrefix(current_prefix, segment)));
    }

    // Removes the last prefix after seeing a ')'.
    if (i < length && paths[i] == ')') {
      if (prefix.empty()) {
        return util::Status(
            util::error::INVALID_ARGUMENT,
            StrCat("Invalid FieldMask '", paths,
                         "'. Cannot find matching '(' for all ')'."));
      }
      prefix.pop();
    }
    previous_position = i + 1;
  }
  if (in_map_key) {
    return util::Status(
        util::error::INVALID_ARGUMENT,
        StrCat("Invalid FieldMask '", paths,
                     "'. Cannot find matching ']' for all '['."));
  }
  if (!prefix.empty()) {
    return util::Status(
        util::error::INVALID_ARGUMENT,
        StrCat("Invalid FieldMask '", paths,
                     "'. Cannot find matching ')' for all '('."));
  }
  return util::Status();
}